

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O3

void __thiscall
notch::core::MakeLayer::MakeLayer(MakeLayer *this,Array *weights,Array *bias,Activation *af)

{
  size_t sVar1;
  valarray<float> *pvVar2;
  float *pfVar3;
  ulong uVar4;
  
  this->nInputs = 0;
  this->nOutputs = 0;
  pvVar2 = (valarray<float> *)operator_new(0x10);
  sVar1 = weights->_M_size;
  pvVar2->_M_size = sVar1;
  uVar4 = sVar1 << 2;
  pfVar3 = (float *)operator_new(uVar4);
  pvVar2->_M_data = pfVar3;
  if (weights->_M_data != (float *)0x0) {
    memcpy(pfVar3,weights->_M_data,uVar4);
  }
  (this->maybeWeights).super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       pvVar2;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<std::valarray<float>*>
            (&(this->maybeWeights).
              super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             pvVar2);
  pvVar2 = (valarray<float> *)operator_new(0x10);
  sVar1 = bias->_M_size;
  pvVar2->_M_size = sVar1;
  uVar4 = sVar1 << 2;
  pfVar3 = (float *)operator_new(uVar4);
  pvVar2->_M_data = pfVar3;
  if (bias->_M_data != (float *)0x0) {
    memcpy(pfVar3,bias->_M_data,uVar4);
  }
  (this->maybeBias).super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       pvVar2;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<std::valarray<float>*>
            (&(this->maybeBias).super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,pvVar2);
  this->maybeActivation = af;
  return;
}

Assistant:

MakeLayer(const Array &weights, const Array &bias, const Activation &af)
        : maybeWeights(std::shared_ptr<Array>(new Array(weights))),
          maybeBias(std::shared_ptr<Array>(new Array(bias))),
          maybeActivation(&af) {}